

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O2

void wasm::
     CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
     ::scan(CFGBuilder *self,Expression **currp)

{
  Id IVar1;
  Expression *this;
  Module *pMVar2;
  uint uVar3;
  Call *pCVar4;
  CallIndirect *pCVar5;
  If *pIVar6;
  CallRef *pCVar7;
  bool *pbVar8;
  Try *pTVar9;
  Expression **currp_00;
  code *pcVar10;
  
  this = *currp;
  IVar1 = this->_id;
  switch(IVar1) {
  case BlockId:
    pcVar10 = doEndBlock;
    break;
  case IfId:
    Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
              ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,doEndIf
               ,currp);
    pIVar6 = Expression::cast<wasm::If>(this);
    if (pIVar6->ifFalse != (Expression *)0x0) {
      pIVar6 = Expression::cast<wasm::If>(this);
      Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,scan,
                 &pIVar6->ifFalse);
      Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,
                 doStartIfFalse,currp);
    }
    pIVar6 = Expression::cast<wasm::If>(this);
    Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
              ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,scan,
               &pIVar6->ifTrue);
    Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
              ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,
               doStartIfTrue,currp);
    pIVar6 = Expression::cast<wasm::If>(this);
    currp = &pIVar6->condition;
    pcVar10 = scan;
    goto LAB_00d209ac;
  case LoopId:
    pcVar10 = doEndLoop;
    break;
  case BreakId:
  case SwitchId:
switchD_00d207fe_caseD_40:
    pcVar10 = doEndBranch;
    break;
  case CallId:
    pCVar4 = Expression::cast<wasm::Call>(this);
    pbVar8 = &pCVar4->isReturn;
    goto LAB_00d2093e;
  case CallIndirectId:
    pCVar5 = Expression::cast<wasm::CallIndirect>(this);
    pbVar8 = &pCVar5->isReturn;
LAB_00d2093e:
    if (*pbVar8 != false) {
switchD_00d2081a_caseD_13:
      pcVar10 = doEndReturn;
      break;
    }
LAB_00d2094c:
    pMVar2 = (self->
             super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             ).super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
             super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.currModule;
    pcVar10 = doEndCall;
    if ((pMVar2 == (Module *)0x0) || (((pMVar2->features).features & 0x40) != 0)) break;
    goto LAB_00d2097c;
  case LocalGetId:
  case LocalSetId:
  case GlobalGetId:
  case GlobalSetId:
  case LoadId:
  case StoreId:
  case ConstId:
  case UnaryId:
  case BinaryId:
  case SelectId:
  case DropId:
switchD_00d207fe_caseD_39:
    if ((this->type).id == 1) {
      pcVar10 = doStartUnreachableBlock;
      break;
    }
    goto LAB_00d2097c;
  case ReturnId:
    goto switchD_00d2081a_caseD_13;
  default:
    switch(IVar1) {
    case TryId:
      Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,
                 doEndTry,currp);
      pTVar9 = Expression::cast<wasm::Try>(this);
      for (uVar3 = 0;
          (ulong)uVar3 <
          (pTVar9->catchBodies).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
          uVar3 = uVar3 + 1) {
        Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                  ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,
                   doEndCatch,currp);
        currp_00 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                             (&(pTVar9->catchBodies).
                               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              ,(ulong)uVar3);
        Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                  ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,
                   scan,currp_00);
        Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                  ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,
                   doStartCatch,currp);
      }
      Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,
                 doStartCatches,currp);
      pTVar9 = Expression::cast<wasm::Try>(this);
      Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,scan,
                 &pTVar9->body);
      pcVar10 = doStartTry;
      goto LAB_00d209ac;
    case TryTableId:
      pcVar10 = doEndTryTable;
      break;
    case ThrowId:
    case RethrowId:
    case ThrowRefId:
      pcVar10 = doEndThrow;
      break;
    case TupleMakeId:
    case TupleExtractId:
    case RefI31Id:
    case I31GetId:
    case RefTestId:
    case RefCastId:
      goto switchD_00d207fe_caseD_39;
    case CallRefId:
      pCVar7 = Expression::cast<wasm::CallRef>(this);
      pbVar8 = &pCVar7->isReturn;
      goto LAB_00d2093e;
    case BrOnId:
      goto switchD_00d207fe_caseD_40;
    default:
      if (IVar1 - 0x5d < 2) {
        pcVar10 = doEndResume;
        break;
      }
      if ((IVar1 != SuspendId) && (IVar1 != StackSwitchId)) goto switchD_00d207fe_caseD_39;
      goto LAB_00d2094c;
    }
  }
  Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
            ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,pcVar10,
             currp);
LAB_00d2097c:
  PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::scan(self,currp);
  if (this->_id == TryTableId) {
    pcVar10 = doStartTryTable;
  }
  else {
    if (this->_id != LoopId) {
      return;
    }
    pcVar10 = doStartLoop;
  }
LAB_00d209ac:
  Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
            ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,pcVar10,
             currp);
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

    switch (curr->_id) {
      case Expression::Id::BlockId: {
        self->pushTask(SubType::doEndBlock, currp);
        break;
      }
      case Expression::Id::IfId: {
        self->pushTask(SubType::doEndIf, currp);
        auto* ifFalse = curr->cast<If>()->ifFalse;
        if (ifFalse) {
          self->pushTask(SubType::scan, &curr->cast<If>()->ifFalse);
          self->pushTask(SubType::doStartIfFalse, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<If>()->ifTrue);
        self->pushTask(SubType::doStartIfTrue, currp);
        self->pushTask(SubType::scan, &curr->cast<If>()->condition);
        return; // don't do anything else
      }
      case Expression::Id::LoopId: {
        self->pushTask(SubType::doEndLoop, currp);
        break;
      }
      case Expression::Id::CallId:
      case Expression::Id::CallIndirectId:
      case Expression::Id::CallRefId: {
        if (isReturnCall(curr)) {
          self->pushTask(SubType::doEndReturn, currp);
        } else {
          auto* module = self->getModule();
          if (!module || module->features.hasExceptionHandling()) {
            // This call might throw, so run the code to handle that.
            self->pushTask(SubType::doEndCall, currp);
          }
        }
        break;
      }
      case Expression::Id::ReturnId:
        self->pushTask(SubType::doEndReturn, currp);
        break;
      case Expression::Id::TryId: {
        self->pushTask(SubType::doEndTry, currp);
        auto& catchBodies = curr->cast<Try>()->catchBodies;
        for (Index i = 0; i < catchBodies.size(); i++) {
          self->pushTask(doEndCatch, currp);
          self->pushTask(SubType::scan, &catchBodies[i]);
          self->pushTask(doStartCatch, currp);
        }
        self->pushTask(SubType::doStartCatches, currp);
        self->pushTask(SubType::scan, &curr->cast<Try>()->body);
        self->pushTask(SubType::doStartTry, currp);
        return; // don't do anything else
      }
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doEndTryTable, currp);
        break;
      }
      case Expression::Id::ThrowId:
      case Expression::Id::RethrowId:
      case Expression::Id::ThrowRefId: {
        self->pushTask(SubType::doEndThrow, currp);
        break;
      }
      case Expression::Id::ResumeId:
      case Expression::Id::ResumeThrowId: {
        self->pushTask(SubType::doEndResume, currp);
        break;
      }
      case Expression::Id::SuspendId:
      case Expression::Id::StackSwitchId: {
        auto* module = self->getModule();
        if (!module || module->features.hasExceptionHandling()) {
          // This might throw, so run the code to handle that.
          self->pushTask(SubType::doEndCall, currp);
        }
        break;
      }
      default: {
        if (Properties::isBranch(curr)) {
          self->pushTask(SubType::doEndBranch, currp);
        } else if (curr->type == Type::unreachable) {
          self->pushTask(SubType::doStartUnreachableBlock, currp);
        }
      }
    }

    PostWalker<SubType, VisitorType>::scan(self, currp);

    switch (curr->_id) {
      case Expression::Id::LoopId: {
        self->pushTask(SubType::doStartLoop, currp);
        break;
      }
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doStartTryTable, currp);
        break;
      }
      default: {}
    }
  }